

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

void av1_calc_proj_params_high_bd_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int j;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 in_XMM2 [16];
  long lVar13;
  long lVar14;
  undefined1 in_XMM3 [16];
  long lVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar18;
  long lVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar28;
  int iVar29;
  undefined1 in_XMM8 [16];
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    lVar4 = (long)src8 * 2;
    lVar5 = (long)dat8 * 2;
    uVar7 = 0;
    uVar3 = 0;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    lVar8 = 0;
    lVar9 = 0;
    lVar10 = 0;
    lVar11 = 0;
    for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 4) {
        auVar24 = pmovzxwd(in_XMM2,*(undefined8 *)(lVar5 + lVar12 * 2));
        auVar27 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar4 + lVar12 * 2));
        piVar1 = flt1 + lVar12;
        auVar19._0_4_ = *piVar1 + auVar24._0_4_ * -0x10;
        auVar19._4_4_ = piVar1[1] + auVar24._4_4_ * -0x10;
        auVar19._8_4_ = piVar1[2] + auVar24._8_4_ * -0x10;
        auVar19._12_4_ = piVar1[3] + auVar24._12_4_ * -0x10;
        auVar32._0_4_ = (auVar27._0_4_ - auVar24._0_4_) * 0x10;
        auVar32._4_4_ = (auVar27._4_4_ - auVar24._4_4_) * 0x10;
        auVar32._8_4_ = (auVar27._8_4_ - auVar24._8_4_) * 0x10;
        auVar32._12_4_ = (auVar27._12_4_ - auVar24._12_4_) * 0x10;
        in_XMM2 = pmuldq(auVar19,auVar19);
        auVar22._4_4_ = auVar19._4_4_;
        auVar22._0_4_ = auVar19._4_4_;
        auVar22._8_4_ = auVar19._12_4_;
        auVar22._12_4_ = auVar19._12_4_;
        auVar27 = pmuldq(auVar19,auVar32);
        auVar24._4_4_ = 0;
        auVar24._0_4_ = auVar32._4_4_;
        auVar24._8_8_ = auVar32._8_8_ >> 0x20;
        in_XMM3 = pmuldq(auVar24,auVar22);
        auVar24 = pmuldq(auVar22,auVar22);
        lVar10 = lVar10 + in_XMM2._0_8_ + auVar24._0_8_;
        lVar11 = lVar11 + in_XMM2._8_8_ + auVar24._8_8_;
        lVar8 = lVar8 + auVar27._0_8_ + in_XMM3._0_8_;
        lVar9 = lVar9 + auVar27._8_8_ + in_XMM3._8_8_;
      }
      flt1 = flt1 + flt1_stride;
      lVar4 = lVar4 + (long)src_stride * 2;
      lVar5 = lVar5 + (long)dat_stride * 2;
    }
    *C = 0;
    C[1] = lVar9 + lVar8;
    H[1][0] = 0;
    H[1][1] = lVar11 + lVar10;
    lVar4 = (long)(height * width);
    H[1][1] = (lVar11 + lVar10) / lVar4;
  }
  else {
    lVar4 = (long)src8 * 2;
    lVar5 = (long)dat8 * 2;
    if (params->r[1] < 1) {
      uVar7 = 0;
      uVar3 = 0;
      if (0 < height) {
        uVar3 = (ulong)(uint)height;
      }
      lVar8 = 0;
      lVar9 = 0;
      lVar10 = 0;
      lVar11 = 0;
      for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
        for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 4) {
          auVar24 = pmovzxwd(in_XMM2,*(undefined8 *)(lVar5 + lVar12 * 2));
          auVar27 = pmovzxwd(in_XMM3,*(undefined8 *)(lVar4 + lVar12 * 2));
          piVar1 = flt0 + lVar12;
          auVar20._0_4_ = *piVar1 + auVar24._0_4_ * -0x10;
          auVar20._4_4_ = piVar1[1] + auVar24._4_4_ * -0x10;
          auVar20._8_4_ = piVar1[2] + auVar24._8_4_ * -0x10;
          auVar20._12_4_ = piVar1[3] + auVar24._12_4_ * -0x10;
          auVar15._0_4_ = (auVar27._0_4_ - auVar24._0_4_) * 0x10;
          auVar15._4_4_ = (auVar27._4_4_ - auVar24._4_4_) * 0x10;
          auVar15._8_4_ = (auVar27._8_4_ - auVar24._8_4_) * 0x10;
          auVar15._12_4_ = (auVar27._12_4_ - auVar24._12_4_) * 0x10;
          in_XMM2 = pmuldq(auVar20,auVar20);
          auVar23._4_4_ = auVar20._4_4_;
          auVar23._0_4_ = auVar20._4_4_;
          auVar23._8_4_ = auVar20._12_4_;
          auVar23._12_4_ = auVar20._12_4_;
          auVar24 = pmuldq(auVar20,auVar15);
          auVar16._4_4_ = 0;
          auVar16._0_4_ = auVar15._4_4_;
          auVar16._8_8_ = auVar15._8_8_ >> 0x20;
          in_XMM3 = pmuldq(auVar16,auVar23);
          auVar27 = pmuldq(auVar23,auVar23);
          lVar10 = lVar10 + in_XMM2._0_8_ + auVar27._0_8_;
          lVar11 = lVar11 + in_XMM2._8_8_ + auVar27._8_8_;
          lVar8 = lVar8 + auVar24._0_8_ + in_XMM3._0_8_;
          lVar9 = lVar9 + auVar24._8_8_ + in_XMM3._8_8_;
        }
        flt0 = flt0 + flt0_stride;
        lVar4 = lVar4 + (long)src_stride * 2;
        lVar5 = lVar5 + (long)dat_stride * 2;
      }
      *C = lVar9 + lVar8;
      C[1] = 0;
      (*H)[0] = lVar11 + lVar10;
      (*H)[1] = 0;
      lVar4 = (long)(height * width);
      (*H)[0] = (lVar11 + lVar10) / lVar4;
      goto LAB_0039e3ca;
    }
    uVar7 = 0;
    uVar3 = 0;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    lVar14 = 0;
    lVar17 = 0;
    lVar12 = 0;
    lVar13 = 0;
    lVar8 = 0;
    lVar9 = 0;
    lVar18 = 0;
    lVar21 = 0;
    lVar10 = 0;
    lVar11 = 0;
    for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
      for (lVar6 = 0; lVar6 < width; lVar6 = lVar6 + 4) {
        auVar27 = pmovzxwd(in_XMM8,*(undefined8 *)(lVar5 + lVar6 * 2));
        auVar24 = pmovzxwd(in_XMM6,*(undefined8 *)(lVar4 + lVar6 * 2));
        piVar1 = flt0 + lVar6;
        piVar2 = flt1 + lVar6;
        iVar26 = auVar27._0_4_;
        iVar28 = auVar27._4_4_;
        iVar29 = auVar27._8_4_;
        iVar30 = auVar27._12_4_;
        in_XMM6._0_4_ = (auVar24._0_4_ - iVar26) * 0x10;
        in_XMM6._4_4_ = (auVar24._4_4_ - iVar28) * 0x10;
        in_XMM6._8_4_ = (auVar24._8_4_ - iVar29) * 0x10;
        in_XMM6._12_4_ = (auVar24._12_4_ - iVar30) * 0x10;
        auVar25._0_4_ = *piVar1 + iVar26 * -0x10;
        auVar25._4_4_ = piVar1[1] + iVar28 * -0x10;
        auVar25._8_4_ = piVar1[2] + iVar29 * -0x10;
        auVar25._12_4_ = piVar1[3] + iVar30 * -0x10;
        auVar27._0_4_ = *piVar2 + iVar26 * -0x10;
        auVar27._4_4_ = piVar2[1] + iVar28 * -0x10;
        auVar27._8_4_ = piVar2[2] + iVar29 * -0x10;
        auVar27._12_4_ = piVar2[3] + iVar30 * -0x10;
        auVar24 = pmuldq(auVar25,auVar25);
        auVar31._4_4_ = auVar25._4_4_;
        auVar31._0_4_ = auVar25._4_4_;
        auVar31._8_4_ = auVar25._12_4_;
        auVar31._12_4_ = auVar25._12_4_;
        auVar32 = pmuldq(auVar31,auVar31);
        lVar10 = lVar10 + auVar24._0_8_ + auVar32._0_8_;
        lVar11 = lVar11 + auVar24._8_8_ + auVar32._8_8_;
        auVar24 = pmuldq(auVar27,auVar25);
        auVar33._4_4_ = auVar27._4_4_;
        auVar33._0_4_ = auVar27._4_4_;
        auVar33._8_4_ = auVar27._12_4_;
        auVar33._12_4_ = auVar27._12_4_;
        auVar32 = pmuldq(auVar33,auVar31);
        lVar18 = lVar18 + auVar24._0_8_ + auVar32._0_8_;
        lVar21 = lVar21 + auVar24._8_8_ + auVar32._8_8_;
        auVar24 = pmuldq(auVar27,auVar27);
        auVar32 = pmuldq(auVar33,auVar33);
        lVar8 = lVar8 + auVar24._0_8_ + auVar32._0_8_;
        lVar9 = lVar9 + auVar24._8_8_ + auVar32._8_8_;
        auVar24 = pmuldq(auVar25,in_XMM6);
        in_XMM8._4_4_ = in_XMM6._4_4_;
        in_XMM8._0_4_ = in_XMM6._4_4_;
        in_XMM8._8_4_ = in_XMM6._12_4_;
        in_XMM8._12_4_ = in_XMM6._12_4_;
        auVar32 = pmuldq(auVar31,in_XMM8);
        lVar12 = lVar12 + auVar24._0_8_ + auVar32._0_8_;
        lVar13 = lVar13 + auVar24._8_8_ + auVar32._8_8_;
        auVar24 = pmuldq(auVar27,in_XMM6);
        auVar27 = pmuldq(auVar33,in_XMM8);
        lVar14 = lVar14 + auVar24._0_8_ + auVar27._0_8_;
        lVar17 = lVar17 + auVar24._8_8_ + auVar27._8_8_;
      }
      flt1 = flt1 + flt1_stride;
      flt0 = flt0 + flt0_stride;
      lVar4 = lVar4 + (long)src_stride * 2;
      lVar5 = lVar5 + (long)dat_stride * 2;
    }
    *C = lVar13 + lVar12;
    C[1] = lVar17 + lVar14;
    lVar4 = (long)(height * width);
    (*H)[0] = (lVar11 + lVar10) / lVar4;
    lVar5 = (lVar21 + lVar18) / lVar4;
    (*H)[1] = lVar5;
    H[1][1] = (lVar9 + lVar8) / lVar4;
    H[1][0] = lVar5;
    *C = *C / lVar4;
  }
  C = C + 1;
LAB_0039e3ca:
  *C = *C / lVar4;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_sse4_1(const uint8_t *src8, int width,
                                         int height, int src_stride,
                                         const uint8_t *dat8, int dat_stride,
                                         int32_t *flt0, int flt0_stride,
                                         int32_t *flt1, int flt1_stride,
                                         int64_t H[2][2], int64_t C[2],
                                         const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                          dat_stride, flt0, flt0_stride, flt1,
                                          flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_sse4_1(src8, width, height, src_stride, dat8,
                                       dat_stride, flt1, flt1_stride, H, C);
  }
}